

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

ArrayFeatureExtractor * __thiscall
CoreML::Specification::Model::mutable_arrayfeatureextractor(Model *this)

{
  ArrayFeatureExtractor *this_00;
  
  if (this->_oneof_case_[0] == 0x261) {
    this_00 = (ArrayFeatureExtractor *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x261;
    this_00 = (ArrayFeatureExtractor *)operator_new(0x28);
    ArrayFeatureExtractor::ArrayFeatureExtractor(this_00);
    (this->Type_).arrayfeatureextractor_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureExtractor* Model::mutable_arrayfeatureextractor() {
  if (!has_arrayfeatureextractor()) {
    clear_Type();
    set_has_arrayfeatureextractor();
    Type_.arrayfeatureextractor_ = new ::CoreML::Specification::ArrayFeatureExtractor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.arrayFeatureExtractor)
  return Type_.arrayfeatureextractor_;
}